

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void attributeDeclSplit(void *ctx,xmlChar *elem,xmlChar *name,int type,int def,xmlChar *defaultValue
                       ,xmlEnumerationPtr tree)

{
  code *UNRECOVERED_JUMPTABLE;
  xmlSchemaSAXPlugPtr ctxt;
  
  if (((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)ctx + 0x10) + 0x40),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)ctx + 0x20));
    return;
  }
  xmlFreeEnumeration(tree);
  return;
}

Assistant:

static void
attributeDeclSplit(void *ctx, const xmlChar * elem,
                   const xmlChar * name, int type, int def,
                   const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->attributeDecl != NULL)) {
	ctxt->user_sax->attributeDecl(ctxt->user_data, elem, name, type,
	                              def, defaultValue, tree);
    } else {
	xmlFreeEnumeration(tree);
    }
}